

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_client_connection.c
# Opt level: O1

int32_t message_client_wait_for_message_transmitted(message_client_connection_t *self)

{
  int iVar1;
  
  if (self != (message_client_connection_t *)0x0) {
    iVar1 = sem_wait((sem_t *)&self->messageTransmitted);
    return iVar1;
  }
  return -1;
}

Assistant:

int32_t message_client_wait_for_message_transmitted(message_client_connection_t *self)
{
   int32_t retval = 0;
   if (self != 0)
   {
#ifdef _WIN32
      DWORD result = WaitForSingleObject(self->messageTransmitted, INFINITE);
      if (result != WAIT_OBJECT_0)
      {
         DWORD lastError = GetLastError();
         fprintf(stderr, "Semaphore wait failed with error %d\n", (int) lastError);
         retval = -1;
      }
#else
      retval = (int32_t) sem_wait(&self->messageTransmitted);
#endif
   }
   else
   {
      retval = -1;
   }
   return retval;
}